

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lha_parse_linkname(archive_string *linkname,archive_string *pathname)

{
  char *pcVar1;
  size_t sVar2;
  size_t symlen;
  char *linkptr;
  archive_string *pathname_local;
  archive_string *linkname_local;
  
  pcVar1 = strchr(pathname->s,0x7c);
  if (pcVar1 != (char *)0x0) {
    sVar2 = strlen(pcVar1 + 1);
    linkname->length = 0;
    archive_strncat(linkname,pcVar1 + 1,sVar2);
    *pcVar1 = '\0';
    sVar2 = strlen(pathname->s);
    pathname->length = sVar2;
  }
  linkname_local._4_4_ = (wchar_t)(pcVar1 != (char *)0x0);
  return linkname_local._4_4_;
}

Assistant:

static int
lha_parse_linkname(struct archive_string *linkname,
    struct archive_string *pathname)
{
	char *	linkptr;
	size_t 	symlen;

	linkptr = strchr(pathname->s, '|');
	if (linkptr != NULL) {
		symlen = strlen(linkptr + 1);
		archive_strncpy(linkname, linkptr+1, symlen);

		*linkptr = 0;
		pathname->length = strlen(pathname->s);

		return (1);
	}
	return (0);
}